

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O1

unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> __thiscall
flow::BasicBlock::replace
          (BasicBlock *this,Instr *oldInstr,
          unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *newInstr)

{
  pointer ppVVar1;
  _Head_base<0UL,_flow::Instr_*,_false> _Var2;
  Value *pVVar3;
  TerminateInstr *pTVar4;
  long lVar5;
  _Head_base<0UL,_flow::Instr_*,_false> *in_RCX;
  pointer ppVVar6;
  pointer *__ptr;
  pointer ppVVar7;
  __uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> local_28;
  
  if (newInstr[9]._M_t.super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
      super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
      super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != oldInstr) {
    __assert_fail("oldInstr->getBasicBlock() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x56,
                  "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                 );
  }
  if (((Value *)((long)in_RCX->_M_head_impl + 0x48))->_vptr_Value != (_func_int **)0x0) {
    __assert_fail("newInstr->getBasicBlock() == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x57,
                  "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                 );
  }
  Value::replaceAllUsesWith((Value *)newInstr,&in_RCX->_M_head_impl->super_Value);
  pTVar4 = getTerminator((BasicBlock *)oldInstr);
  if (pTVar4 == (TerminateInstr *)newInstr) {
    remove(this,(char *)oldInstr);
    local_28._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
    super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
         (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)in_RCX->_M_head_impl;
    in_RCX->_M_head_impl = (Instr *)0x0;
    push_back((BasicBlock *)oldInstr,
              (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_28);
    if ((_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)
        local_28._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl == (Instr *)0x0) {
      return (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>)this;
    }
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                          super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl + 8))();
    return (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>)this;
  }
  if ((in_RCX->_M_head_impl != (Instr *)0x0) &&
     (lVar5 = __dynamic_cast(in_RCX->_M_head_impl,&Instr::typeinfo,&TerminateInstr::typeinfo,0),
     lVar5 != 0)) {
    __assert_fail("dynamic_cast<TerminateInstr*>(newInstr.get()) == nullptr && \"Most not be a terminator instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x60,
                  "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                 );
  }
  ppVVar6 = (oldInstr->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (oldInstr->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)ppVVar1 - (long)ppVVar6 >> 5;
  ppVVar7 = ppVVar6;
  if (0 < lVar5) {
    ppVVar7 = (pointer)(((long)ppVVar1 - (long)ppVVar6 & 0xffffffffffffffe0U) + (long)ppVVar6);
    lVar5 = lVar5 + 1;
    ppVVar6 = ppVVar6 + 2;
    do {
      if (ppVVar6[-2] == (Value *)newInstr) {
        ppVVar6 = ppVVar6 + -2;
        goto LAB_0013ba31;
      }
      if (ppVVar6[-1] == (Value *)newInstr) {
        ppVVar6 = ppVVar6 + -1;
        goto LAB_0013ba31;
      }
      if (*ppVVar6 == (Value *)newInstr) goto LAB_0013ba31;
      if (ppVVar6[1] == (Value *)newInstr) {
        ppVVar6 = ppVVar6 + 1;
        goto LAB_0013ba31;
      }
      lVar5 = lVar5 + -1;
      ppVVar6 = ppVVar6 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)ppVVar1 - (long)ppVVar7 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      ppVVar6 = ppVVar1;
      if ((lVar5 != 3) || (ppVVar6 = ppVVar7, *ppVVar7 == (Value *)newInstr)) goto LAB_0013ba31;
      ppVVar7 = ppVVar7 + 1;
    }
    ppVVar6 = ppVVar7;
    if (*ppVVar7 == (Value *)newInstr) goto LAB_0013ba31;
    ppVVar7 = ppVVar7 + 1;
  }
  ppVVar6 = ppVVar7;
  if (*ppVVar7 != (Value *)newInstr) {
    ppVVar6 = ppVVar1;
  }
LAB_0013ba31:
  if (ppVVar6 != ppVVar1) {
    newInstr[9]._M_t.super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
    super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
    super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl = (Instr *)0x0;
    in_RCX->_M_head_impl->basicBlock_ = (BasicBlock *)oldInstr;
    (this->super_Value)._vptr_Value = (_func_int **)*ppVVar6;
    *ppVVar6 = (Value *)0x0;
    _Var2._M_head_impl = in_RCX->_M_head_impl;
    in_RCX->_M_head_impl = (Instr *)0x0;
    pVVar3 = *ppVVar6;
    *ppVVar6 = &(_Var2._M_head_impl)->super_Value;
    if (pVVar3 != (Value *)0x0) {
      (*pVVar3->_vptr_Value[1])();
    }
    return (__uniq_ptr_data<flow::Instr,_std::default_delete<flow::Instr>,_true,_true>)
           (__uniq_ptr_data<flow::Instr,_std::default_delete<flow::Instr>,_true,_true>)this;
  }
  __assert_fail("i != code_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                ,0x66,
                "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)")
  ;
}

Assistant:

std::unique_ptr<Instr> BasicBlock::replace(Instr* oldInstr,
                                           std::unique_ptr<Instr> newInstr) {
  assert(oldInstr->getBasicBlock() == this);
  assert(newInstr->getBasicBlock() == nullptr);

  oldInstr->replaceAllUsesWith(newInstr.get());

  if (oldInstr == getTerminator()) {
    std::unique_ptr<Instr> removedInstr = remove(oldInstr);
    push_back(std::move(newInstr));
    return removedInstr;
  } else {
    assert(dynamic_cast<TerminateInstr*>(newInstr.get()) == nullptr && "Most not be a terminator instruction.");

    auto i = std::find_if(
        code_.begin(), code_.end(),
        [&](const auto& obj) { return obj.get() == oldInstr; });

    assert(i != code_.end());

    oldInstr->setParent(nullptr);
    newInstr->setParent(this);

    std::unique_ptr<Instr> removedInstr = std::move(*i);
    *i = std::move(newInstr);
    return removedInstr;
  }
}